

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O0

QStringList * QGenericUnixTheme::iconFallbackPaths(void)

{
  ulong uVar1;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QStringList *paths;
  char16_t *str;
  QFileInfo pixmapsIconsDir;
  DataPointer *in_stack_ffffffffffffff68;
  QArrayDataPointer<char16_t> *this;
  QArrayDataPointer<char16_t> local_40;
  undefined1 local_28 [24];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->d)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<QString>::QList((QList<QString> *)0xae43c8);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_40,(Data *)0x0,L"/usr/share/pixmaps",0x12);
  QString::QString((QString *)this,in_stack_ffffffffffffff68);
  QFileInfo::QFileInfo((QFileInfo *)&local_10,(QString *)local_28);
  QString::~QString((QString *)0xae443a);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
  uVar1 = QFileInfo::isDir();
  if ((uVar1 & 1) != 0) {
    QFileInfo::absoluteFilePath();
    QList<QString>::append((QList<QString> *)this,(rvalue_ref)in_stack_ffffffffffffff68);
    QString::~QString((QString *)0xae4482);
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QGenericUnixTheme::iconFallbackPaths()
{
    QStringList paths;
    const QFileInfo pixmapsIconsDir(QStringLiteral("/usr/share/pixmaps"));
    if (pixmapsIconsDir.isDir())
        paths.append(pixmapsIconsDir.absoluteFilePath());

    return paths;
}